

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall OIDType::serialise(OIDType *this,uint8_t *buf,size_t max_len)

{
  pointer __src;
  ulong uVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -0x1f;
  if (1 < max_len) {
    uVar1 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    *buf = (char)(this->super_BER_CONTAINER)._type;
    lVar5 = 2;
    puVar2 = buf + 1;
    if (0x7f < uVar1) {
      if (uVar1 < 0x101) {
        puVar2 = buf + 2;
        lVar5 = 3;
        uVar3 = 0x81;
      }
      else {
        puVar2 = buf + 3;
        buf[2] = (uint8_t)(uVar1 >> 8);
        lVar5 = 4;
        uVar3 = 0x82;
      }
      buf[1] = uVar3;
    }
    *puVar2 = (uint8_t)uVar1;
    if ((uVar1 + lVar5 <= max_len) && (iVar4 = -0x25, this->valid == true)) {
      __src = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start;
      memcpy(buf + lVar5,__src,
             (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      iVar4 = ((int)(buf + lVar5) +
              (*(int *)&(this->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
              *(int *)&(this->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start)) - (int)buf;
    }
  }
  return iVar4;
}

Assistant:

int OIDType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, this->data.size());
    CHECK_ENCODE_ERR(i);
    if(!this->valid) return SNMP_BUFFER_ENCODE_ERROR_INVALID_OID;

    uint8_t* ptr = buf + i;
    memcpy(ptr, this->data.data(), this->data.size());

    ptr += this->data.size();
    return ptr - buf;
}